

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckEqualWithUnsignedLong::RunImpl
          (TestCheckEqualWithUnsignedLong *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_60;
  unsigned_long local_30;
  unsigned_long something;
  TestResults results;
  TestCheckEqualWithUnsignedLong *this_local;
  
  results._16_8_ = this;
  UnitTest::TestResults::TestResults((TestResults *)&something,(TestReporter *)0x0);
  local_30 = 2;
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_60,*ppTVar2,0xe);
  UnitTest::CheckEqual<unsigned_long,unsigned_long>(results_00,&local_30,&local_30,&local_60);
  return;
}

Assistant:

TEST(CheckEqualWithUnsignedLong)
{
    TestResults results;
    unsigned long something = 2;
    CHECK_EQUAL(something, something);
}